

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsClippedEx(ImRect *bb,ImGuiID id,bool clip_even_when_logged)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  
  pIVar1 = GImGui;
  bVar2 = ImRect::Overlaps(bb,&GImGui->CurrentWindow->ClipRect);
  if (((bVar2) || ((id != 0 && ((pIVar1->ActiveId == id || (pIVar1->NavId == id)))))) ||
     ((bVar2 = true, !clip_even_when_logged && (pIVar1->LogEnabled == true)))) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::IsClippedEx(const ImRect& bb, ImGuiID id, bool clip_even_when_logged)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!bb.Overlaps(window->ClipRect))
        if (id == 0 || (id != g.ActiveId && id != g.NavId))
            if (clip_even_when_logged || !g.LogEnabled)
                return true;
    return false;
}